

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O2

void __thiscall BibIndexer::completeIndex(BibIndexer *this)

{
  TSNode rootNode_00;
  TSNode rootNode_01;
  uint __line;
  TSTree *self;
  char *__assertion;
  TSNode rootNode;
  
  clearCached(this);
  if (this->file == (File *)0x0) {
    __assertion = "file != nullptr";
    __line = 0x52;
  }
  else {
    self = File::getParseTree(this->file);
    if (self != (TSTree *)0x0) {
      ts_tree_root_node(&rootNode,self);
      rootNode_00.context[2] = rootNode.context[2];
      rootNode_00.context[3] = rootNode.context[3];
      rootNode_00.context[0] = rootNode.context[0];
      rootNode_00.context[1] = rootNode.context[1];
      rootNode_00.id = rootNode.id;
      rootNode_00.tree = rootNode.tree;
      lintErrors(this,rootNode_00);
      rootNode_01.context[2] = rootNode.context[2];
      rootNode_01.context[3] = rootNode.context[3];
      rootNode_01.context[0] = rootNode.context[0];
      rootNode_01.context[1] = rootNode.context[1];
      rootNode_01.id = rootNode.id;
      rootNode_01.tree = rootNode.tree;
      lintFile(this,rootNode_01);
      publishErrors(this);
      return;
    }
    __assertion = "tree != nullptr";
    __line = 0x55;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/biber/BibIndexer.cpp"
                ,__line,"void BibIndexer::completeIndex()");
}

Assistant:

void BibIndexer::completeIndex () {
    clearCached();
    assert (file != nullptr);

    const TSTree *tree = file->getParseTree();
    assert (tree != nullptr);

    TSNode rootNode = ts_tree_root_node(tree);

    lintErrors(rootNode);

    lintFile(rootNode);

    publishErrors();
}